

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbtsub.c
# Opt level: O0

void bitbltsub(LispPTR *argv)

{
  ushort uVar1;
  ushort uVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint x;
  uint y;
  uint w_00;
  uint h_00;
  uint uVar6;
  uint uVar7;
  LispPTR *pLVar8;
  LispPTR *pLVar9;
  LispPTR *pLVar10;
  DLword *pDVar11;
  sbyte sVar12;
  uint uVar14;
  int iVar15;
  int iVar16;
  uint *puVar17;
  long lVar18;
  bool bVar19;
  bool bVar20;
  uint local_218;
  int local_214;
  uint local_210;
  uint local_20c;
  uint local_208;
  uint local_204;
  uint local_198;
  int local_194;
  uint local_190;
  uint local_18c;
  uint local_188;
  uint local_184;
  uint local_180;
  uint local_17c;
  uint local_178;
  uint local_174;
  undefined4 local_170;
  undefined4 local_16c;
  uint local_164;
  uint local_160;
  int local_15c;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  uint local_138;
  int srcRshift;
  uint newS;
  uint savedS;
  uint shS;
  uint *src32addr;
  uint *dst32addr;
  uint sdw_mask;
  uint postloop_mask;
  uint preloop_mask;
  int bb_fast;
  uint *OrigDstAddr;
  uint *OrigSrcAddr;
  int fwd;
  int src32rbit;
  int dst32rbit;
  int abc;
  UNSIGNED x32ia;
  UNSIGNED x32nbyt;
  UNSIGNED x32byta;
  uint local_c8;
  uint mask;
  uint dstdata;
  uint dstold;
  uint srcRmask;
  int dst32lbit;
  int srcLshift;
  int src32lbit;
  int dstnumL;
  int num_lines_remaining;
  DLword *base;
  BITMAP *texture68k;
  BITMAP *destbm;
  BITMAP *srcebm;
  PILOTBBT *pbt;
  LispPTR *args;
  undefined1 auStack_70 [2];
  undefined1 auStack_6e [2];
  DLword grayword [4];
  int curr_gray_line;
  int num_gray;
  int gray;
  DLword *dstbase;
  DLword *srcbase;
  int op;
  int src_comp;
  int dstbpl;
  int srcbpl;
  int dx;
  int sx;
  int backwardflg;
  int w;
  int h;
  int wyoffset;
  int wxoffset;
  int texture;
  int dty;
  int sty;
  int operation;
  int sourcetype;
  LispPTR *argv_local;
  sbyte sVar13;
  
  bVar3 = false;
  src_comp = 0x7fffffff;
  bVar4 = false;
  grayword[2] = 0;
  grayword[3] = 0;
  grayword[0] = 0;
  grayword[1] = 0;
  memset((void *)((long)&args + 4),0,8);
  pLVar8 = NativeAligned4FromLAddr(*argv);
  pLVar9 = NativeAligned4FromLAddr(argv[1]);
  srcbpl = argv[2] & 0xffff;
  uVar5 = argv[3] & 0xffff;
  pLVar10 = NativeAligned4FromLAddr(argv[4]);
  uVar7 = argv[5];
  x = uVar7 & 0xffff;
  y = argv[6] & 0xffff;
  if (argv[8] == 0) {
    local_160 = (uint)INPUT_atom;
  }
  else {
    local_160 = argv[8];
  }
  if (argv[9] == 0) {
    local_164 = (uint)REPLACE_atom;
  }
  else {
    local_164 = argv[9];
  }
  w_00 = (uint)*(ushort *)((long)pLVar8 + 0x12);
  h_00 = (uint)(ushort)pLVar8[4];
  if ((h_00 != 0) && (w_00 != 0)) {
    if (local_160 == INVERT_atom) {
      bVar19 = local_164 != ERASE_atom;
    }
    else {
      bVar19 = local_164 == ERASE_atom;
    }
    if (local_164 == PAINT_atom) {
      local_16c = 2;
    }
    else {
      if (local_164 == ERASE_atom) {
        local_170 = 1;
      }
      else {
        local_170 = 0;
        if (local_164 == INVERT_atom) {
          local_170 = 3;
        }
      }
      local_16c = local_170;
    }
    uVar1 = *(ushort *)((long)pLVar10 + 6);
    op = (uint)uVar1 * 0x10;
    if (local_160 == TEXTURE_atom) {
      uVar5 = argv[10];
      if (argv[0xb] == 0) {
        local_174 = 0;
      }
      else {
        local_174 = argv[0xb] & 0xffff;
      }
      if (argv[0xc] == 0) {
        local_178 = 0;
      }
      else {
        local_178 = argv[0xc] & 0xffff;
      }
      local_17c = x;
      if (local_174 != 0) {
        local_17c = x - local_174;
      }
      srcbpl = (int)local_17c % 0x10;
      _num_gray = NativeAligned2FromLAddr(*pLVar10 + *(ushort *)((long)pLVar10 + 6) * y);
      bVar4 = true;
      if (uVar5 == 0) {
        args._4_2_ = 0;
        dstbase = (DLword *)((long)&args + 4);
        grayword[2] = 1;
        grayword[3] = 0;
        grayword[0] = 0;
        grayword[1] = 0;
      }
      else if ((*(ushort *)((ulong)(MDStypetbl + ((int)(uVar5 & 0xfffff00) >> 9)) ^ 2) & 0x1000) ==
               0) {
        pLVar8 = NativeAligned4FromLAddr(uVar5);
        pDVar11 = NativeAligned2FromLAddr(*pLVar8);
        if ((ushort)pLVar8[1] < 0x10) {
          local_180 = (uint)(ushort)pLVar8[1];
        }
        else {
          local_180 = 0x10;
        }
        grayword[2] = (undefined2)local_180;
        grayword[3] = local_180._2_2_;
        grayword._0_4_ = (y + local_178) % local_180;
        dstbase = pDVar11 + (int)grayword._0_4_;
      }
      else {
        uVar6 = uVar5 & 0xffff;
        if (uVar6 == 0) {
          args._4_2_ = 0;
          dstbase = (DLword *)((long)&args + 4);
          grayword[2] = 1;
          grayword[3] = 0;
          grayword[0] = 0;
          grayword[1] = 0;
        }
        else if (uVar6 == 0xffff) {
          args._4_2_ = 0xffff;
          dstbase = (DLword *)((long)&args + 4);
          grayword[2] = 1;
          grayword[3] = 0;
          grayword[0] = 0;
          grayword[1] = 0;
        }
        else {
          iVar15 = (int)uVar6 >> 0xc;
          *(ushort *)((long)&args + 4U ^ 2) =
               (ushort)iVar15 | (ushort)(iVar15 << 4) | (ushort)(iVar15 << 8) |
               (ushort)(iVar15 << 0xc);
          uVar14 = (int)uVar6 >> 8;
          *(ushort *)((long)&args + 6U ^ 2) =
               (ushort)(uVar6 >> 8) & 0xf | (ushort)((uVar14 & 0xf) << 4) |
               (ushort)((uVar14 & 0xf) << 8) | (ushort)((uVar14 & 0xf) << 0xc);
          uVar6 = (int)uVar6 >> 4;
          *(ushort *)((ulong)auStack_70 ^ 2) =
               (ushort)uVar6 & 0xf | (ushort)((uVar6 & 0xf) << 4) | (ushort)((uVar6 & 0xf) << 8) |
               (ushort)((uVar6 & 0xf) << 0xc);
          *(ushort *)((ulong)auStack_6e ^ 2) =
               (ushort)uVar5 & 0xf | (ushort)((uVar5 & 0xf) << 4) | (ushort)((uVar5 & 0xf) << 8) |
               (ushort)((uVar5 & 0xf) << 0xc);
          grayword[2] = 4;
          grayword[3] = 0;
          grayword._0_4_ = y + local_178 & 3;
          dstbase = (DLword *)((long)&args + 4U + (long)(int)grayword._0_4_ * 2);
        }
      }
    }
    else {
      uVar2 = *(ushort *)((long)pLVar9 + 6);
      src_comp = (uint)uVar2 * 0x10;
      if ((((pLVar9 == pLVar10) && (uVar5 <= y)) && (y <= uVar5 + h_00)) &&
         ((uVar5 != y || (((uint)srcbpl < x && (x < srcbpl + w_00)))))) {
        bVar3 = true;
      }
      if (bVar3) {
        dstbase = NativeAligned2FromLAddr
                            (*pLVar9 + (uint)*(ushort *)((long)pLVar9 + 6) * (uVar5 + h_00 + -1));
        _num_gray = NativeAligned2FromLAddr
                              (*pLVar10 + (uint)*(ushort *)((long)pLVar10 + 6) * (y + h_00 + -1));
        src_comp = (uint)uVar2 * -0x10;
        op = (uint)uVar1 * -0x10;
      }
      else {
        dstbase = NativeAligned2FromLAddr(*pLVar9 + *(ushort *)((long)pLVar9 + 6) * uVar5);
        _num_gray = NativeAligned2FromLAddr(*pLVar10 + *(ushort *)((long)pLVar10 + 6) * y);
      }
    }
    ScreenLocked = 1;
    srcRmask = 0;
    dstdata = 0;
    OrigSrcAddr._4_4_ = 0;
    OrigDstAddr = (uint *)0x0;
    srcRshift = 0;
    local_138 = 0;
    uVar5 = src_comp | op;
    if (bVar4) {
      if ((int)x < 0) {
        lVar18 = -(long)((int)(7 - x) >> 3);
      }
      else {
        lVar18 = (long)((int)x >> 3);
      }
      x32nbyt = (long)_num_gray + lVar18;
      _preloop_mask = (uint *)(x32nbyt - (x32nbyt & 3));
      dstold = (int)((x32nbyt & 3) << 3) + (uVar7 & 7);
      fwd = (dstold + w_00) - 1 & 0x1f;
      if (dstold == 0) {
        local_184 = 0xffffffff;
      }
      else {
        local_184 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
      }
      sdw_mask = local_184;
      dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
      dst32addr._0_4_ = local_184 & dst32addr._4_4_;
      srcLshift = ((int)(dstold + w_00) >> 5) + -1;
      dst32lbit = srcbpl & 0xf;
      uVar5 = op;
    }
    else {
      if (bVar3) {
        uVar7 = (x + w_00) - 1;
        if ((int)uVar7 < 0) {
          lVar18 = -(long)((int)(7 - uVar7) >> 3);
        }
        else {
          lVar18 = (long)((int)uVar7 >> 3);
        }
        x32nbyt = (long)_num_gray + lVar18;
        _preloop_mask = (uint *)(x32nbyt - (x32nbyt & 3));
        fwd = (int)((x32nbyt & 3) << 3) + (uVar7 & 7);
        dstold = (fwd - w_00) + 1 & 0x1f;
        sdw_mask = -1 << (0x1fU - (char)fwd & 0x1f);
        if (dstold == 0) {
          local_190 = 0xffffffff;
        }
        else {
          local_190 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
        }
        dst32addr._4_4_ = local_190;
        dst32addr._0_4_ = sdw_mask & local_190;
        if ((int)((w_00 - fwd) + -1) < 1) {
          local_194 = 0;
        }
        else {
          local_194 = (int)((w_00 - fwd) + -1) >> 5;
        }
        srcLshift = local_194;
        uVar7 = (srcbpl + w_00) - 1;
        if ((int)uVar7 < 0) {
          lVar18 = -(long)((int)(7 - uVar7) >> 3);
        }
        else {
          lVar18 = (long)((int)uVar7 >> 3);
        }
        x32nbyt = (long)dstbase + lVar18;
        OrigDstAddr = (uint *)(x32nbyt - (x32nbyt & 3));
        OrigSrcAddr._4_4_ = (int)((x32nbyt & 3) << 3) + (uVar7 & 7);
        dst32lbit = (OrigSrcAddr._4_4_ - w_00) + 1 & 0x1f;
        local_138 = dstold - dst32lbit;
        srcRmask = dst32lbit - dstold & 0x1f;
        if (srcRmask == 0) {
          local_198 = 0;
        }
        else {
          local_198 = -1 << (sbyte)srcRmask ^ 0xffffffff;
        }
        dstdata = local_198;
      }
      else {
        if ((int)x < 0) {
          lVar18 = -(long)((int)(7 - x) >> 3);
        }
        else {
          lVar18 = (long)((int)x >> 3);
        }
        x32nbyt = (long)_num_gray + lVar18;
        _preloop_mask = (uint *)(x32nbyt - (x32nbyt & 3));
        dstold = (int)((x32nbyt & 3) << 3) + (uVar7 & 7);
        fwd = (dstold + w_00) - 1 & 0x1f;
        if (dstold == 0) {
          local_188 = 0xffffffff;
        }
        else {
          local_188 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
        }
        sdw_mask = local_188;
        dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
        dst32addr._0_4_ = local_188 & dst32addr._4_4_;
        srcLshift = ((int)(dstold + w_00) >> 5) + -1;
        if (srcbpl < 0) {
          lVar18 = -(long)(7 - srcbpl >> 3);
        }
        else {
          lVar18 = (long)(srcbpl >> 3);
        }
        x32nbyt = (long)dstbase + lVar18;
        OrigDstAddr = (uint *)(x32nbyt - (x32nbyt & 3));
        dst32lbit = (int)((x32nbyt & 3) << 3) + (srcbpl & 7U);
        OrigSrcAddr._4_4_ = (dst32lbit + w_00) - 1 & 0x1f;
        local_138 = dstold - dst32lbit;
        srcRmask = dst32lbit - dstold & 0x1f;
        if (srcRmask == 0) {
          local_18c = 0xffffffff;
        }
        else {
          local_18c = -1 << (sbyte)srcRmask ^ 0xffffffff;
        }
        dstdata = local_18c;
      }
      local_138 = local_138 & 0x1f;
    }
    bVar20 = (uVar5 & 0x1f) != 0;
    _savedS = OrigDstAddr;
    src32lbit = h_00;
    while( true ) {
      src32addr = _preloop_mask;
      iVar15 = src32lbit + -1;
      if (src32lbit < 1) break;
      if (bVar4) {
        srcRmask = dst32lbit - dstold & 0xf;
        uVar7 = CONCAT22(*dstbase,*dstbase) << (sbyte)srcRmask;
        newS = uVar7 >> 0x10 | uVar7;
        if (bVar19) {
          newS = newS ^ 0xffffffff;
        }
        if (dstold + w_00 < 0x21) {
          x32byta._4_4_ = (uint)dst32addr;
        }
        else {
          local_c8 = *_preloop_mask;
          uVar7 = local_c8 & ~sdw_mask;
          switch(local_16c) {
          case 0:
            local_c8 = newS;
            break;
          case 1:
            local_c8 = newS & local_c8;
            break;
          case 2:
            local_c8 = newS | local_c8;
            break;
          case 3:
            local_c8 = newS ^ local_c8;
          }
          *_preloop_mask = local_c8 & sdw_mask | uVar7;
          src32addr = _preloop_mask + 1;
          switch(local_16c) {
          case 0:
            local_13c = srcLshift;
            while (local_13c = local_13c + -1, -1 < local_13c) {
              *src32addr = newS;
              src32addr = src32addr + 1;
            }
            break;
          case 1:
            local_13c = srcLshift;
            while (local_13c = local_13c + -1, -1 < local_13c) {
              *src32addr = newS & *src32addr;
              src32addr = src32addr + 1;
            }
            break;
          case 2:
            local_13c = srcLshift;
            while (local_13c = local_13c + -1, -1 < local_13c) {
              *src32addr = newS | *src32addr;
              src32addr = src32addr + 1;
            }
            break;
          case 3:
            local_13c = srcLshift;
            while (local_13c = local_13c + -1, -1 < local_13c) {
              *src32addr = newS ^ *src32addr;
              src32addr = src32addr + 1;
            }
          }
          if (fwd == 0x1f) goto LAB_0011113f;
          x32byta._4_4_ = dst32addr._4_4_;
        }
LAB_00111078:
        local_c8 = *src32addr;
        uVar7 = local_c8 & ~x32byta._4_4_;
        switch(local_16c) {
        case 0:
          local_c8 = newS;
          break;
        case 1:
          local_c8 = newS & local_c8;
          break;
        case 2:
          local_c8 = newS | local_c8;
          break;
        case 3:
          local_c8 = newS ^ local_c8;
        }
        *src32addr = uVar7 | x32byta._4_4_ & local_c8;
      }
      else {
        sVar12 = (sbyte)local_138;
        sVar13 = (sbyte)srcRmask;
        if (bVar3) {
          if ((OrigSrcAddr._4_4_ < (uint)fwd) && (dstold + 1 < dst32lbit + w_00)) {
            puVar17 = _savedS + -1;
            uVar7 = *_savedS;
            _savedS = _savedS + -2;
            newS = uVar7 >> sVar12 & dstdata | *puVar17 << sVar13;
            srcRshift = *puVar17 >> sVar12 & dstdata;
          }
          else {
            if (OrigSrcAddr._4_4_ < (uint)fwd) {
              newS = *_savedS >> sVar12 & dstdata;
            }
            else {
              newS = *_savedS << sVar13;
              srcRshift = *_savedS >> sVar12 & dstdata;
            }
            _savedS = _savedS + -1;
          }
          if (bVar19) {
            newS = newS ^ 0xffffffff;
          }
          if (dstold + w_00 < 0x21) {
            x32byta._4_4_ = (uint)dst32addr;
          }
          else {
            local_c8 = *_preloop_mask;
            uVar7 = local_c8 & ~sdw_mask;
            switch(local_16c) {
            case 0:
              local_c8 = newS;
              break;
            case 1:
              local_c8 = newS & local_c8;
              break;
            case 2:
              local_c8 = newS | local_c8;
              break;
            case 3:
              local_c8 = newS ^ local_c8;
            }
            *_preloop_mask = uVar7 | sdw_mask & local_c8;
            src32addr = _preloop_mask + -1;
            if (dst32lbit == dstold) {
              if (bVar19) {
                switch(local_16c) {
                case 0:
                  local_150 = srcLshift;
                  while (local_150 = local_150 + -1, -1 < local_150) {
                    *src32addr = *_savedS ^ 0xffffffff;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                  break;
                case 1:
                  local_150 = srcLshift;
                  while (local_150 = local_150 + -1, -1 < local_150) {
                    *src32addr = (*_savedS ^ 0xffffffff) & *src32addr;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                  break;
                case 2:
                  local_150 = srcLshift;
                  while (local_150 = local_150 + -1, -1 < local_150) {
                    *src32addr = *_savedS ^ 0xffffffff | *src32addr;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                  break;
                case 3:
                  local_150 = srcLshift;
                  while (local_150 = local_150 + -1, -1 < local_150) {
                    *src32addr = *_savedS ^ 0xffffffff ^ *src32addr;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                }
              }
              else {
                switch(local_16c) {
                case 0:
                  local_154 = srcLshift;
                  while (local_154 = local_154 + -1, -1 < local_154) {
                    *src32addr = *_savedS;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                  break;
                case 1:
                  local_154 = srcLshift;
                  while (local_154 = local_154 + -1, -1 < local_154) {
                    *src32addr = *_savedS & *src32addr;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                  break;
                case 2:
                  local_154 = srcLshift;
                  while (local_154 = local_154 + -1, -1 < local_154) {
                    *src32addr = *_savedS | *src32addr;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                  break;
                case 3:
                  local_154 = srcLshift;
                  while (local_154 = local_154 + -1, -1 < local_154) {
                    *src32addr = *_savedS ^ *src32addr;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                }
              }
            }
            else if (bVar19) {
              switch(local_16c) {
              case 0:
                local_158 = srcLshift;
                while (local_158 = local_158 + -1, -1 < local_158) {
                  uVar7 = srcRshift | *_savedS << sVar13;
                  srcRshift = *_savedS >> sVar12;
                  *src32addr = uVar7 ^ 0xffffffff;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 1:
                local_158 = srcLshift;
                while (local_158 = local_158 + -1, -1 < local_158) {
                  uVar7 = srcRshift | *_savedS << sVar13;
                  srcRshift = *_savedS >> sVar12;
                  *src32addr = (uVar7 ^ 0xffffffff) & *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 2:
                local_158 = srcLshift;
                while (local_158 = local_158 + -1, -1 < local_158) {
                  uVar7 = srcRshift | *_savedS << sVar13;
                  srcRshift = *_savedS >> sVar12;
                  *src32addr = uVar7 ^ 0xffffffff | *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 3:
                local_158 = srcLshift;
                while (local_158 = local_158 + -1, -1 < local_158) {
                  uVar7 = srcRshift | *_savedS << sVar13;
                  srcRshift = *_savedS >> sVar12;
                  *src32addr = uVar7 ^ 0xffffffff ^ *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
              }
            }
            else {
              switch(local_16c) {
              case 0:
                local_15c = srcLshift;
                while (local_15c = local_15c + -1, -1 < local_15c) {
                  uVar7 = srcRshift | *_savedS << sVar13;
                  srcRshift = *_savedS >> sVar12;
                  *src32addr = uVar7;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 1:
                local_15c = srcLshift;
                while (local_15c = local_15c + -1, -1 < local_15c) {
                  uVar7 = srcRshift | *_savedS << sVar13;
                  srcRshift = *_savedS >> sVar12;
                  *src32addr = uVar7 & *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 2:
                local_15c = srcLshift;
                while (local_15c = local_15c + -1, -1 < local_15c) {
                  uVar7 = srcRshift | *_savedS << sVar13;
                  srcRshift = *_savedS >> sVar12;
                  *src32addr = uVar7 | *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 3:
                local_15c = srcLshift;
                while (local_15c = local_15c + -1, -1 < local_15c) {
                  uVar7 = srcRshift | *_savedS << sVar13;
                  srcRshift = *_savedS >> sVar12;
                  *src32addr = uVar7 ^ *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
              }
            }
            if (dstold == 0) goto LAB_0011113f;
            if ((uint)dst32lbit < dstold) {
              newS = srcRshift;
            }
            else {
              newS = srcRshift | *_savedS << sVar13;
            }
            if (bVar19) {
              newS = newS ^ 0xffffffff;
            }
            x32byta._4_4_ = dst32addr._4_4_;
          }
          goto LAB_00111078;
        }
        if ((dstold < (uint)dst32lbit) && (0x20 < dst32lbit + w_00)) {
          puVar17 = _savedS + 1;
          uVar7 = *_savedS;
          _savedS = _savedS + 2;
          newS = uVar7 << sVar13 | *puVar17 >> sVar12 & dstdata;
          srcRshift = *puVar17 << sVar13 & (dstdata ^ 0xffffffff);
        }
        else {
          if (dstold < (uint)dst32lbit) {
            newS = *_savedS << sVar13;
          }
          else {
            newS = *_savedS >> sVar12 & dstdata;
            srcRshift = *_savedS << sVar13 & (dstdata ^ 0xffffffff);
          }
          _savedS = _savedS + 1;
        }
        if (bVar19) {
          newS = newS ^ 0xffffffff;
        }
        if (dstold + w_00 < 0x21) {
          x32byta._4_4_ = (uint)dst32addr;
          goto LAB_00111078;
        }
        local_c8 = *_preloop_mask;
        uVar7 = local_c8 & ~sdw_mask;
        switch(local_16c) {
        case 0:
          local_c8 = newS;
          break;
        case 1:
          local_c8 = newS & local_c8;
          break;
        case 2:
          local_c8 = newS | local_c8;
          break;
        case 3:
          local_c8 = newS ^ local_c8;
        }
        *_preloop_mask = uVar7 | sdw_mask & local_c8;
        src32addr = _preloop_mask + 1;
        if (dst32lbit == dstold) {
          if (bVar19) {
            switch(local_16c) {
            case 0:
              local_140 = srcLshift;
              while (local_140 = local_140 + -1, -1 < local_140) {
                *src32addr = *_savedS ^ 0xffffffff;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 1:
              local_140 = srcLshift;
              while (local_140 = local_140 + -1, -1 < local_140) {
                *src32addr = (*_savedS ^ 0xffffffff) & *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 2:
              local_140 = srcLshift;
              while (local_140 = local_140 + -1, -1 < local_140) {
                *src32addr = *_savedS ^ 0xffffffff | *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 3:
              local_140 = srcLshift;
              while (local_140 = local_140 + -1, -1 < local_140) {
                *src32addr = *_savedS ^ 0xffffffff ^ *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
            }
          }
          else {
            switch(local_16c) {
            case 0:
              local_144 = srcLshift;
              while (local_144 = local_144 + -1, -1 < local_144) {
                *src32addr = *_savedS;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 1:
              local_144 = srcLshift;
              while (local_144 = local_144 + -1, -1 < local_144) {
                *src32addr = *_savedS & *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 2:
              local_144 = srcLshift;
              while (local_144 = local_144 + -1, -1 < local_144) {
                *src32addr = *_savedS | *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 3:
              local_144 = srcLshift;
              while (local_144 = local_144 + -1, -1 < local_144) {
                *src32addr = *_savedS ^ *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
            }
          }
        }
        else if (bVar19) {
          switch(local_16c) {
          case 0:
            local_148 = srcLshift;
            while (local_148 = local_148 + -1, -1 < local_148) {
              uVar7 = srcRshift | *_savedS >> sVar12;
              srcRshift = *_savedS << sVar13;
              *src32addr = uVar7 ^ 0xffffffff;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 1:
            local_148 = srcLshift;
            while (local_148 = local_148 + -1, -1 < local_148) {
              uVar7 = srcRshift | *_savedS >> sVar12;
              srcRshift = *_savedS << sVar13;
              *src32addr = (uVar7 ^ 0xffffffff) & *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 2:
            local_148 = srcLshift;
            while (local_148 = local_148 + -1, -1 < local_148) {
              uVar7 = srcRshift | *_savedS >> sVar12;
              srcRshift = *_savedS << sVar13;
              *src32addr = uVar7 ^ 0xffffffff | *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 3:
            local_148 = srcLshift;
            while (local_148 = local_148 + -1, -1 < local_148) {
              uVar7 = srcRshift | *_savedS >> sVar12;
              srcRshift = *_savedS << sVar13;
              *src32addr = uVar7 ^ 0xffffffff ^ *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
          }
        }
        else {
          switch(local_16c) {
          case 0:
            local_14c = srcLshift;
            while (local_14c = local_14c + -1, -1 < local_14c) {
              uVar7 = srcRshift | *_savedS >> sVar12;
              srcRshift = *_savedS << sVar13;
              *src32addr = uVar7;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 1:
            local_14c = srcLshift;
            while (local_14c = local_14c + -1, -1 < local_14c) {
              uVar7 = srcRshift | *_savedS >> sVar12;
              srcRshift = *_savedS << sVar13;
              *src32addr = uVar7 & *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 2:
            local_14c = srcLshift;
            while (local_14c = local_14c + -1, -1 < local_14c) {
              uVar7 = srcRshift | *_savedS >> sVar12;
              srcRshift = *_savedS << sVar13;
              *src32addr = uVar7 | *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 3:
            local_14c = srcLshift;
            while (local_14c = local_14c + -1, -1 < local_14c) {
              uVar7 = srcRshift | *_savedS >> sVar12;
              srcRshift = *_savedS << sVar13;
              *src32addr = uVar7 ^ *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
          }
        }
        if (fwd != 0x1f) {
          if ((uint)fwd < OrigSrcAddr._4_4_) {
            newS = srcRshift;
          }
          else {
            newS = srcRshift | *_savedS >> sVar12 & dstdata;
          }
          if (bVar19) {
            newS = newS ^ 0xffffffff;
          }
          x32byta._4_4_ = dst32addr._4_4_;
          goto LAB_00111078;
        }
      }
LAB_0011113f:
      iVar16 = op >> 5;
      src32lbit = iVar15;
      if (bVar4) {
        if (bVar20) {
          iVar16 = (int)(op + dstold) >> 5;
          dstold = op + dstold & 0x1f;
          fwd = (dstold + w_00) - 1 & 0x1f;
          if (dstold == 0) {
            local_204 = 0xffffffff;
          }
          else {
            local_204 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
          }
          sdw_mask = local_204;
          dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
          dst32addr._0_4_ = local_204 & dst32addr._4_4_;
          srcLshift = ((int)(dstold + w_00) >> 5) + -1;
        }
        _preloop_mask = _preloop_mask + iVar16;
        grayword._0_4_ = grayword._0_4_ + 1;
        if ((int)grayword._0_4_ < (int)grayword._4_4_) {
          dstbase = dstbase + 1;
        }
        else {
          grayword[0] = 0;
          grayword[1] = 0;
          dstbase = dstbase + -(long)(grayword._4_4_ + -1);
        }
      }
      else {
        iVar15 = src_comp >> 5;
        if (bVar3) {
          if (bVar20) {
            uVar7 = op + fwd;
            if ((int)uVar7 < 0) {
              lVar18 = (long)((int)(0x1f - uVar7) >> 5) * -4;
            }
            else {
              lVar18 = (long)((int)dstold >> 5) * 4;
            }
            fwd = uVar7 & 0x1f;
            dstold = (fwd - w_00) + 1 & 0x1f;
            sdw_mask = -1 << (0x1fU - (char)fwd & 0x1f);
            if (dstold == 0) {
              local_210 = 0xffffffff;
            }
            else {
              local_210 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
            }
            dst32addr._4_4_ = local_210;
            dst32addr._0_4_ = sdw_mask & local_210;
            if ((int)((w_00 - fwd) + -1) < 1) {
              local_214 = 0;
            }
            else {
              local_214 = (int)((w_00 - fwd) + -1) >> 5;
            }
            srcLshift = local_214;
          }
          else {
            lVar18 = (long)iVar16 * 4;
          }
          src32addr = (uint *)((long)_preloop_mask + lVar18);
          if (bVar20) {
            uVar7 = src_comp + OrigSrcAddr._4_4_;
            if ((int)uVar7 < 0) {
              lVar18 = (long)((int)(0x1f - uVar7) >> 5) * -4;
            }
            else {
              lVar18 = (long)((int)uVar7 >> 5) * 4;
            }
            OrigSrcAddr._4_4_ = uVar7 & 0x1f;
            dst32lbit = (OrigSrcAddr._4_4_ - w_00) + 1 & 0x1f;
            local_138 = dstold - dst32lbit & 0x1f;
            srcRmask = dst32lbit - dstold & 0x1f;
            if (srcRmask == 0) {
              local_218 = 0;
            }
            else {
              local_218 = -1 << (sbyte)srcRmask ^ 0xffffffff;
            }
            dstdata = local_218;
          }
          else {
            lVar18 = (long)iVar15 * 4;
          }
          _savedS = (uint *)((long)OrigDstAddr + lVar18);
          _preloop_mask = src32addr;
          OrigDstAddr = _savedS;
        }
        else {
          if (bVar20) {
            iVar16 = (int)(op + dstold) >> 5;
            dstold = op + dstold & 0x1f;
            fwd = (dstold + w_00) - 1 & 0x1f;
            if (dstold == 0) {
              local_208 = 0xffffffff;
            }
            else {
              local_208 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
            }
            sdw_mask = local_208;
            dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
            dst32addr._0_4_ = local_208 & dst32addr._4_4_;
            srcLshift = ((int)(dstold + w_00) >> 5) + -1;
          }
          _preloop_mask = _preloop_mask + iVar16;
          if (bVar20) {
            iVar15 = src_comp + dst32lbit >> 5;
            dst32lbit = src_comp + dst32lbit & 0x1f;
            OrigSrcAddr._4_4_ = (dst32lbit + w_00) - 1 & 0x1f;
            local_138 = dstold - dst32lbit & 0x1f;
            srcRmask = dst32lbit - dstold & 0x1f;
            if (srcRmask == 0) {
              local_20c = 0xffffffff;
            }
            else {
              local_20c = -1 << (sbyte)srcRmask ^ 0xffffffff;
            }
            dstdata = local_20c;
          }
          OrigDstAddr = OrigDstAddr + iVar15;
          _savedS = OrigDstAddr;
        }
      }
    }
    if ((DisplayRegion68k <= _num_gray) && (_num_gray <= DISP_MAX_Address)) {
      flush_display_region(x,y,w_00,h_00);
    }
    ScreenLocked = 0;
  }
  return;
}

Assistant:

void bitbltsub(LispPTR *argv) {
  int sourcetype, operation;
  int sty, dty, texture, wxoffset, wyoffset;
  int h, w;
#ifdef REALCURSOR
  int displayflg = 0;
#endif
  int backwardflg = 0, sx, dx, srcbpl=2147483647, dstbpl, src_comp, op;
  DLword *srcbase, *dstbase;
  int gray = 0, num_gray = 0, curr_gray_line = 0;
  DLword grayword[4] = {0, 0, 0, 0};

  { /* Initialization code, in a block so it optimizes independently */
    LispPTR *args = argv;
    PILOTBBT *pbt;
    BITMAP *srcebm, *destbm;
    BITMAP *texture68k;
    DLword *base;

#ifdef INIT
    init_kbd_startup;
#endif

    pbt = (PILOTBBT *)NativeAligned4FromLAddr(args[0]);
    srcebm = (BITMAP *)NativeAligned4FromLAddr(args[1]);
    sx = (args[2] & 0xFFFF);
    sty = (args[3] & 0xFFFF);
    destbm = (BITMAP *)NativeAligned4FromLAddr(args[4]);
    dx = (args[5] & 0xFFFF);
    dty = (args[6] & 0xFFFF);
    sourcetype = (args[8] == NIL_PTR ? INPUT_atom : args[8]);
    operation = (args[9] == NIL_PTR ? REPLACE_atom : args[9]);

    w = pbt->pbtwidth;
    h = pbt->pbtheight;
    if ((h <= 0) || (w <= 0)) return;
    src_comp = bbsrc_type(sourcetype, operation);
    op = bbop(sourcetype, operation);

    dstbpl = destbm->bmrasterwidth << 4;

    if (sourcetype == TEXTURE_atom) {
      texture = args[10];
      wxoffset = (args[11] == NIL_PTR ? 0 : args[11] & 0xFFFF);
      wyoffset = (args[12] == NIL_PTR ? 0 : args[12] & 0xFFFF);
      sx = ((wxoffset) ? (dx - wxoffset) : dx) % BITSPERWORD;
      dstbase = (DLword *)NativeAligned2FromLAddr(ADDBASE(destbm->bmbase, destbm->bmrasterwidth * dty));
      gray = 1;
      if (texture == NIL_PTR) { /* White Shade */
        grayword[0] = 0;
        srcbase = &grayword[0];
        num_gray = 1;
        curr_gray_line = 0;
        goto do_it_now;
      } else if (IsNumber(texture)) {
        if ((texture &= 0xffff) == 0) { /* White Shade */
          grayword[0] = 0;
          srcbase = &grayword[0];
          num_gray = 1;
          curr_gray_line = 0;
          goto do_it_now;
        } else if (texture == 0xffff) { /* Black Shade */
          grayword[0] = 0xFFFF;
          srcbase = &grayword[0];
          num_gray = 1;
          curr_gray_line = 0;
          goto do_it_now;
        } else { /* 4x4 */
          srcbase = base = (DLword *)(&grayword[0]);
          GETWORD(base++) = Expand4Bit(((texture >> 12) & 0xf));
          GETWORD(base++) = Expand4Bit(((texture >> 8) & 0xf));
          GETWORD(base++) = Expand4Bit(((texture >> 4) & 0xf));
          GETWORD(base++) = Expand4Bit((texture & 0xf));
          num_gray = 4;
          curr_gray_line = (dty + wyoffset) & 3;
          srcbase += curr_gray_line;
          goto do_it_now;
        }
      } else { /* A bitmap that is 16 bits wide. */
        texture68k = (BITMAP *)NativeAligned4FromLAddr(texture);
        srcbase = (DLword *)NativeAligned2FromLAddr(texture68k->bmbase);
        num_gray = min(texture68k->bmheight, 16);
        curr_gray_line = (dty + wyoffset) % num_gray;
        srcbase += curr_gray_line;
        goto do_it_now;
      }
    }
    /* ; INPUT or INVERT      */
    srcbpl = srcebm->bmrasterwidth << 4;

    /* compute flags */
    /* out for now
    if(srcebm == destbm)
    if(sty <= dty)
    if(dty <= (sty + h))
    if((sty != dty) || ((sx < dx) && (dx < (sx + w))))
                      backwardflg = T;
    out for now */
    /* compute flags */
    if (srcebm != destbm)
      ;
    else if (sty > dty)
      ;
    else if (dty > (sty + h))
      ;
    else if ((sty != dty) || ((sx < dx) && (dx < (sx + w))))
      backwardflg = T;

    if (backwardflg) {
      srcbase = (DLword *)NativeAligned2FromLAddr(
          ADDBASE(srcebm->bmbase, srcebm->bmrasterwidth * (sty + h - 1)));
      dstbase = (DLword *)NativeAligned2FromLAddr(
          ADDBASE(destbm->bmbase, destbm->bmrasterwidth * (dty + h - 1)));
      srcbpl = 0 - srcbpl;
      dstbpl = 0 - dstbpl;
    } else {
      srcbase = (DLword *)NativeAligned2FromLAddr(ADDBASE(srcebm->bmbase, srcebm->bmrasterwidth * sty));
      dstbase = (DLword *)NativeAligned2FromLAddr(ADDBASE(destbm->bmbase, destbm->bmrasterwidth * dty));
    }
#ifdef REALCURSOR
    displayflg = n_new_cursorin(srcbase, sx, sty, w, h);
#endif /* REALCURSOR */
  }

do_it_now:
#ifdef DOS
  currentdsp->device.locked++;
#else
  ScreenLocked = T;
#endif /* DOS */

#ifdef REALCURSOR
  displayflg |= n_new_cursorin(dstbase, dx, dty, w, h);
  if (displayflg) HideCursor;
#endif /* REALCURSOR */

#ifdef NEWBITBLT
  bitblt(srcbase, dstbase, sx, dx, w, h, srcbpl, dstbpl, backwardflg, src_comp, op, gray, num_gray,
         curr_gray_line);
#else
  new_bitblt_code;
#endif

#ifdef DISPLAYBUFFER
#ifdef COLOR
  if (MonoOrColor == MONO_SCREEN)
#endif /* COLOR */

    /* Copy the changed section of display bank to the frame buffer */
    if (in_display_segment(dstbase)) {
      /*      DBPRINT(("bltsub: x %d, y %d, w %d, h %d.\n",dx, dty, w,h)); */
      flush_display_region(dx, dty, w, h);
    }
#endif

#ifdef XWINDOW
  if (in_display_segment(dstbase)) flush_display_region(dx, dty, w, h);
#endif /* XWINDOW */

#ifdef SDL
  if (in_display_segment(dstbase)) flush_display_region(dx, dty, w, h);
#endif /* XWINDOW */

#ifdef DOS
  /* Copy the changed section of display bank to the frame buffer */
  if (in_display_segment(dstbase)) {
    /*      DBPRINT(("bltsub: x %d, y %d, w %d, h %d.\n",dx, dty, w,h)); */
    flush_display_region(dx, dty, w, h);
  }
#endif /* DOS */

#ifdef REALCURSOR
  if (displayflg) ShowCursor;
#endif /* REALCURSOR */

#ifdef DOS
  currentdsp->device.locked--;
#else
  ScreenLocked = NIL;
#endif /* DOS */

}